

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  double value;
  bool bVar1;
  CppType CVar2;
  int32_t iVar3;
  uint32_t x;
  Type TVar4;
  int64_t iVar5;
  uint64_t x_00;
  char *__s;
  size_type sVar6;
  EnumValueDescriptor *this_00;
  LogMessage *pLVar7;
  uint *b;
  AlphaNum *b_00;
  allocator *paVar8;
  AlphaNum *a;
  EnumValueDescriptor *descriptor;
  AlphaNum *in_R8;
  float value_00;
  string_view src;
  string_view to_escape;
  string_view src_00;
  string_view to_escape_00;
  LogMessage local_450;
  Voidify local_43a;
  allocator<char> local_439;
  AlphaNum local_438;
  lts_20250127 *local_408;
  size_t sStack_400;
  string local_3f8;
  undefined1 local_3d8 [16];
  string local_3c8;
  AlphaNum local_3a8;
  AlphaNum local_378;
  AlphaNum local_348;
  undefined1 local_318 [16];
  string local_308;
  undefined1 local_2e8 [16];
  string local_2d8;
  AlphaNum local_2b8;
  AlphaNum local_288;
  size_t local_258;
  size_t sStack_250;
  AlphaNum local_240;
  allocator local_209;
  undefined1 local_208 [8];
  string bytes;
  uint32_t length;
  string_view default_string;
  undefined1 local_1c8 [6];
  bool has_default_value;
  string local_1a8;
  AlphaNum local_188;
  AlphaNum local_158;
  AlphaNum local_128;
  AlphaNum local_f8;
  allocator<char> local_c1;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nil",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(local_18);
    b = &switchD_00433de9::switchdataD_00ac43c8;
    switch(CVar2) {
    case CPPTYPE_INT32:
      iVar3 = FieldDescriptor::default_value_int32(local_18);
      if (iVar3 == -0x80000000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"-0x80000000",local_2d);
        std::allocator<char>::~allocator(local_2d);
      }
      else {
        iVar3 = FieldDescriptor::default_value_int32(local_18);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_60,iVar3);
        absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_60,a);
      }
      break;
    case CPPTYPE_INT64:
      iVar5 = FieldDescriptor::default_value_int64(local_18);
      b_00 = (AlphaNum *)0x8000000000000000;
      if (iVar5 == -0x8000000000000000) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"-0x8000000000000000LL",&local_c1);
        std::allocator<char>::~allocator(&local_c1);
      }
      else {
        iVar5 = FieldDescriptor::default_value_int64(local_18);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_f8,iVar5);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_128,"LL");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)&local_f8,&local_128,b_00);
      }
      break;
    case CPPTYPE_UINT32:
      x = FieldDescriptor::default_value_uint32(local_18);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_90,x);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,"U");
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_90,&local_c0,(AlphaNum *)b);
      break;
    case CPPTYPE_UINT64:
      x_00 = FieldDescriptor::default_value_uint64(local_18);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_158,x_00);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_188,"ULL");
      absl::lts_20250127::StrCat_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&local_158,&local_188,(AlphaNum *)b);
      break;
    case CPPTYPE_DOUBLE:
      value = FieldDescriptor::default_value_double(local_18);
      io::SimpleDtoa_abi_cxx11_(&local_1a8,(io *)this,value);
      anon_unknown_0::HandleExtremeFloatingPoint(__return_storage_ptr__,&local_1a8,false);
      std::__cxx11::string::~string((string *)&local_1a8);
      break;
    case CPPTYPE_FLOAT:
      value_00 = FieldDescriptor::default_value_float(local_18);
      io::SimpleFtoa_abi_cxx11_((string *)local_1c8,(io *)this,value_00);
      anon_unknown_0::HandleExtremeFloatingPoint(__return_storage_ptr__,(string *)local_1c8,true);
      std::__cxx11::string::~string((string *)local_1c8);
      break;
    case CPPTYPE_BOOL:
      bVar1 = FieldDescriptor::default_value_bool(local_18);
      __s = "NO";
      if (bVar1) {
        __s = "YES";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,
                 (allocator<char> *)((long)&default_string._M_str + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&default_string._M_str + 7));
      break;
    case CPPTYPE_ENUM:
      this_00 = FieldDescriptor::default_value_enum(local_18);
      EnumValueName_abi_cxx11_(__return_storage_ptr__,(objectivec *)this_00,descriptor);
      break;
    case CPPTYPE_STRING:
      default_string._M_str._6_1_ = FieldDescriptor::has_default_value(local_18);
      _length = FieldDescriptor::default_value_string(local_18);
      if (((default_string._M_str._6_1_ & 1) == 0) ||
         (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&length), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"nil",
                   (allocator<char> *)(bytes.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(bytes.field_2._M_local_buf + 0xf));
      }
      else {
        TVar4 = FieldDescriptor::type(local_18);
        if (TVar4 == TYPE_BYTES) {
          sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::length
                            ((basic_string_view<char,_std::char_traits<char>_> *)&length);
          bytes.field_2._8_4_ = ghtonl((uint32_t)sVar6);
          paVar8 = &local_209;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_208,bytes.field_2._M_local_buf + 8,4,paVar8);
          std::allocator<char>::~allocator((allocator<char> *)&local_209);
          local_258 = (size_t)_length;
          sStack_250 = default_string._M_len;
          absl::lts_20250127::AlphaNum::AlphaNum(&local_240,_length);
          absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_208,&local_240);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_288,"(NSData*)\"");
          local_318 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_208);
          src._M_len = local_318._8_8_;
          src._M_str = (char *)paVar8;
          absl::lts_20250127::CEscape_abi_cxx11_(&local_308,local_318._0_8_,src);
          local_2e8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_308)
          ;
          to_escape._M_len = local_2e8._8_8_;
          to_escape._M_str = (char *)paVar8;
          EscapeTrigraphs_abi_cxx11_(&local_2d8,local_2e8._0_8_,to_escape);
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_2b8,&local_2d8);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_348,"\"");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (__return_storage_ptr__,(lts_20250127 *)&local_288,&local_2b8,&local_348,in_R8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_308);
          std::__cxx11::string::~string((string *)local_208);
        }
        else {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_378,"@\"");
          local_408 = _length;
          sStack_400 = default_string._M_len;
          src_00._M_str = (char *)b;
          src_00._M_len = default_string._M_len;
          absl::lts_20250127::CEscape_abi_cxx11_(&local_3f8,_length,src_00);
          local_3d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3f8)
          ;
          to_escape_00._M_len = local_3d8._8_8_;
          to_escape_00._M_str = (char *)b;
          EscapeTrigraphs_abi_cxx11_(&local_3c8,local_3d8._0_8_,to_escape_00);
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_3a8,&local_3c8);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_438,"\"");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (__return_storage_ptr__,(lts_20250127 *)&local_378,&local_3a8,&local_438,in_R8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3f8);
        }
      }
      break;
    case CPPTYPE_MESSAGE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"nil",&local_439);
      std::allocator<char>::~allocator(&local_439);
      break;
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_450,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/helpers.cc"
                 ,0x131);
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_450);
      pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar7,(char (*) [16])"Can\'t get here.");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_43a,pLVar7);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_450);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field) {
  // Repeated fields don't have defaults.
  if (field->is_repeated()) {
    return "nil";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == INT_MIN) {
        return "-0x80000000";
      }
      return absl::StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return absl::StrCat(field->default_value_uint32(), "U");
    case FieldDescriptor::CPPTYPE_INT64:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int64() == LLONG_MIN) {
        return "-0x8000000000000000LL";
      }
      return absl::StrCat(field->default_value_int64(), "LL");
    case FieldDescriptor::CPPTYPE_UINT64:
      return absl::StrCat(field->default_value_uint64(), "ULL");
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return HandleExtremeFloatingPoint(
          io::SimpleDtoa(field->default_value_double()), false);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return HandleExtremeFloatingPoint(
          io::SimpleFtoa(field->default_value_float()), true);
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "YES" : "NO";
    case FieldDescriptor::CPPTYPE_STRING: {
      const bool has_default_value = field->has_default_value();
      absl::string_view default_string = field->default_value_string();
      if (!has_default_value || default_string.empty()) {
        // If the field is defined as being the empty string,
        // then we will just assign to nil, as the empty string is the
        // default for both strings and data.
        return "nil";
      }
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        // We want constant fields in our data structures so we can
        // declare them as static. To achieve this we cheat and stuff
        // a escaped c string (prefixed with a length) into the data
        // field, and cast it to an (NSData*) so it will compile.
        // The runtime library knows how to handle it.

        // Must convert to a standard byte order for packing length into
        // a cstring.
        uint32_t length = ghtonl((uint32_t)default_string.length());
        std::string bytes((const char*)&length, sizeof(length));
        absl::StrAppend(&bytes, default_string);
        return absl::StrCat("(NSData*)\"",
                            EscapeTrigraphs(absl::CEscape(bytes)), "\"");
      } else {
        return absl::StrCat(
            "@\"", EscapeTrigraphs(absl::CEscape(default_string)), "\"");
      }
    }
    case FieldDescriptor::CPPTYPE_ENUM:
      return EnumValueName(field->default_value_enum());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "nil";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  ABSL_LOG(FATAL) << "Can't get here.";
  return std::string();
}